

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::SilentEntitySystem::ClearEntityAppearanceList(SilentEntitySystem *this)

{
  pointer pEVar1;
  pointer pEVar2;
  pointer pEVar3;
  
  pEVar1 = (this->m_vEA).
           super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->m_vEA).
           super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar3 = pEVar1;
  if (pEVar2 != pEVar1) {
    do {
      (**(pEVar3->super_DataTypeBase)._vptr_DataTypeBase)(pEVar3);
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar2);
    (this->m_vEA).
    super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar1;
  }
  this->m_ui16NumOfAppearanceRecords = 0;
  return;
}

Assistant:

void SilentEntitySystem::ClearEntityAppearanceList()
{
    m_vEA.clear();
    m_ui16NumOfAppearanceRecords = 0;
}